

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

ReservedRange * __thiscall
google::protobuf::EnumDescriptor::FindReservedRangeContainingNumber(EnumDescriptor *this,int number)

{
  ReservedRange *pRVar1;
  int index;
  
  index = 0;
  do {
    if (this->reserved_range_count_ <= index) {
      return (ReservedRange *)0x0;
    }
    pRVar1 = reserved_range(this,index);
    if (pRVar1->start <= number) {
      pRVar1 = reserved_range(this,index);
      if (number <= pRVar1->end) {
        pRVar1 = reserved_range(this,index);
        return pRVar1;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

const EnumDescriptor::ReservedRange*
EnumDescriptor::FindReservedRangeContainingNumber(int number) const {
  // TODO: Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start &&
        number <= reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}